

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int act_mod_hdrs(nt_opts *opts)

{
  FILE *__stream;
  int iVar1;
  nifti_1_header *hdr;
  nifti_image *nim;
  size_t sVar2;
  char *fname;
  char *pcVar3;
  uint uVar4;
  long lVar5;
  int swap;
  char *local_48;
  char func [13];
  
  builtin_strncpy(func + 8,"hdrs",5);
  builtin_strncpy(func,"act_mod_",8);
  if (2 < g_debug) {
    fprintf(_stderr,"-d modifying %d fields for %d nifti headers...\n",
            (ulong)(uint)(opts->flist).len,(ulong)(uint)(opts->infiles).len);
  }
  if ((0 < (opts->flist).len) && (iVar1 = (opts->infiles).len, 0 < iVar1)) {
    local_48 = opts->command;
    for (lVar5 = 0; lVar5 < iVar1; lVar5 = lVar5 + 1) {
      fname = (opts->infiles).list[lVar5];
      iVar1 = nifti_is_gzfile(fname);
      if (iVar1 == 0) {
        hdr = nt_read_header(opts,fname,&swap,0);
        if (hdr == (nifti_1_header *)0x0) {
          return 1;
        }
        if (1 < g_debug) {
          fprintf(_stderr,"-d modifying %d fields of \'%s\' header\n",(ulong)(uint)(opts->flist).len
                  ,fname);
          __stream = _stderr;
          iVar1 = nifti_hdr_looks_good(hdr);
          pcVar3 = "valid";
          if (iVar1 == 0) {
            pcVar3 = "invalid";
          }
          fprintf(__stream,"-d header is: %s\n",pcVar3);
        }
        iVar1 = modify_all_fields(hdr,opts,g_hdr_fields,0x2b);
        if (iVar1 != 0) {
          free(hdr);
          return 1;
        }
        if (opts->prefix == (char *)0x0) {
          if (swap != 0) {
            uVar4 = 0;
            if ((((hdr->magic[0] == 'n') && (uVar4 = 0, hdr->magic[3] == '\0')) &&
                ((uVar4 = 0, hdr->magic[1] == 'i' || (hdr->magic[1] == '+')))) &&
               ((byte)(hdr->magic[2] - 0x31U) < 9)) {
              uVar4 = (uint)(byte)(hdr->magic[2] - 0x30);
            }
            swap_nifti_header(hdr,uVar4);
          }
          pcVar3 = (char *)0x0;
        }
        else {
          nim = nt_image_read(opts,fname,1);
          pcVar3 = local_48;
          if (nim == (nifti_image *)0x0) {
            fprintf(_stderr,"** failed to dup file \'%s\' before modifying\n",fname);
            return 1;
          }
          if (opts->keep_hist != 0) {
            sVar2 = strlen(local_48);
            iVar1 = nifti_add_extension(nim,pcVar3,(int)sVar2,6);
            if (iVar1 != 0) {
              fwrite("** failed to add command to image as exten\n",0x2b,1,_stderr);
            }
          }
          iVar1 = nifti_set_filenames(nim,opts->prefix,1,1);
          if (iVar1 != 0) {
            fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",func,"failed to set prefix for new file: ",
                    opts->prefix);
            nifti_image_free(nim);
            return 1;
          }
          fname = nifti_strdup(nim->fname);
          nifti_image_write(nim);
          if (0x15b < nim->iname_offset) {
            hdr->vox_offset = (float)nim->iname_offset;
          }
          nifti_image_free(nim);
          pcVar3 = fname;
        }
        write_hdr_to_file(hdr,fname);
        free(pcVar3);
        free(hdr);
      }
      else {
        fprintf(_stderr,"** sorry, cannot modify a gzipped file: %s\n",fname);
      }
      iVar1 = (opts->infiles).len;
    }
  }
  return 0;
}

Assistant:

int act_mod_hdrs( nt_opts * opts )
{
   nifti_1_header * nhdr;
   nifti_image    * nim;         /* for reading/writing entire datasets */
   int              filec, swap;
   char           * fname, * dupname;
   char             func[] = { "act_mod_hdrs" };

   if( g_debug > 2 )
      fprintf(stderr,"-d modifying %d fields for %d nifti headers...\n",
              opts->flist.len, opts->infiles.len);
   if( opts->flist.len <= 0 || opts->infiles.len <= 0 ) return 0;

   for( filec = 0; filec < opts->infiles.len; filec++ )
   {
      fname = opts->infiles.list[filec];  /* for convenience and mod file */

      if( nifti_is_gzfile(fname) ){
         fprintf(stderr,"** sorry, cannot modify a gzipped file: %s\n", fname);
         continue;
      }

      /* do not validate the header structure */
      nhdr = nt_read_header(opts, fname, &swap, 0);
      if( !nhdr ) return 1;

      if( g_debug > 1 )
      {
         fprintf(stderr,"-d modifying %d fields of '%s' header\n",
                 opts->flist.len, fname);
         fprintf(stderr,"-d header is: %s\n",
                 nifti_hdr_looks_good(nhdr) ? "valid" : "invalid");
      }

      /* okay, let's actually trash the data fields */
      if( modify_all_fields(nhdr, opts, g_hdr_fields, NT_HDR_NUM_FIELDS) )
      {
         free(nhdr);
         return 1;
      }

      dupname = NULL;                     /* unless we duplicate file   */

      /* possibly duplicate the current dataset before writing new header */
      if( opts->prefix )
      {
         nim = nt_image_read(opts, fname, 1); /* get data */
         if( !nim ) {
            fprintf(stderr,"** failed to dup file '%s' before modifying\n",
                    fname);
            return 1;
         }
         if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                                strlen(opts->command), NIFTI_ECODE_COMMENT) )
               fprintf(stderr,"** failed to add command to image as exten\n");
         if( nifti_set_filenames(nim, opts->prefix, 1, 1) )
         {
            NTL_FERR(func,"failed to set prefix for new file: ",opts->prefix);
            nifti_image_free(nim);
            return 1;
         }
         dupname = nifti_strdup(nim->fname);  /* so we know to free it */
         fname = dupname;
         nifti_image_write(nim);  /* create the duplicate file */
         /* if we added a history note, get the new offset into the header */
         /* mod: if the new offset is valid, use it    31 Jan 2006 [rickr] */
         if( nim->iname_offset >= 348 ) nhdr->vox_offset = nim->iname_offset;
         nifti_image_free(nim);
      }
      else if ( swap )
         swap_nifti_header(nhdr, NIFTI_VERSION(*nhdr));

      /* if all is well, overwrite header in fname dataset */
      (void)write_hdr_to_file(nhdr, fname); /* errors printed in function */

      if( dupname ) free(dupname);
      free(nhdr);
   }

   return 0;
}